

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::DoubleToDecimalCast<double,int>
               (double input,int *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  InvalidInputException *this;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  CastParameters *this_00;
  uchar in_R8B;
  string error;
  string local_78;
  double local_58;
  Exception local_48;
  undefined1 local_38 [16];
  
  this_00 = parameters;
  local_58 = round(*(double *)
                    (NumericHelper::DOUBLE_POWERS_OF_TEN +
                    (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8) * input);
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  bVar2 = local_58 < dVar1;
  bVar3 = -dVar1 < local_58;
  if (bVar3 && bVar2) {
    bVar4 = Value::IsFinite<double>(local_58);
    if (((!bVar4) || (local_58 < -2147483648.0)) || (2147483648.0 <= local_58)) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,int>(&local_78,(duckdb *)this_00,local_58);
      InvalidInputException::InvalidInputException(this,(string *)&local_78);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    *result = (int)local_58;
  }
  else {
    local_48._0_8_ = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Could not cast value %f to DECIMAL(%d,%d)","");
    Exception::ConstructMessage<double,unsigned_char,unsigned_char>
              (&local_78,&local_48,(string *)(ulong)width,input,scale,in_R8B);
    if ((undefined1 *)local_48._0_8_ != local_38) {
      operator_delete((void *)local_48._0_8_);
    }
    HandleCastError::AssignError(&local_78,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return bVar3 && bVar2;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	// For some reason PG does not use statistical rounding here (even though it _does_ for integers...)
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(roundedValue));
	return true;
}